

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O2

void null_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                 JDIMENSION output_row,int num_rows)

{
  uint uVar1;
  uint uVar2;
  JSAMPROW pJVar3;
  ulong uVar4;
  ulong uVar5;
  JSAMPLE *pJVar6;
  ulong uVar7;
  
  uVar1 = cinfo->num_components;
  uVar2 = cinfo->image_width;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  while (0 < num_rows) {
    num_rows = num_rows + -1;
    for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
      pJVar3 = output_buf[uVar5][output_row];
      pJVar6 = *input_buf + uVar5;
      for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
        pJVar3[uVar7] = *pJVar6;
        pJVar6 = pJVar6 + (int)uVar1;
      }
    }
    input_buf = input_buf + 1;
    output_row = output_row + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
null_convert (j_decompress_ptr cinfo,
	      JSAMPIMAGE input_buf, JDIMENSION input_row,
	      JSAMPARRAY output_buf, int num_rows)
{
  register JSAMPROW inptr, outptr;
  register JDIMENSION count;
  register int num_components = cinfo->num_components;
  JDIMENSION num_cols = cinfo->output_width;
  int ci;

  while (--num_rows >= 0) {
    for (ci = 0; ci < num_components; ci++) {
      inptr = input_buf[ci][input_row];
      outptr = output_buf[0] + ci;
      for (count = num_cols; count > 0; count--) {
	*outptr = *inptr++;	/* needn't bother with GETJSAMPLE() here */
	outptr += num_components;
      }
    }
    input_row++;
    output_buf++;
  }
}